

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.h
# Opt level: O0

void __thiscall SCCLiveness::SCCLiveness(SCCLiveness *this,Func *func,JitArenaAllocator *tempAlloc)

{
  JitArenaAllocator *pJVar1;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  TrackAllocData local_58;
  JitArenaAllocator *local_20;
  JitArenaAllocator *tempAlloc_local;
  Func *func_local;
  SCCLiveness *this_local;
  
  this->func = func;
  this->tempAlloc = tempAlloc;
  this->curLoop = (Loop *)0x0;
  this->lastCall = 0;
  this->lastNonOpHelperCall = 0;
  this->loopNest = 0;
  this->lastOpHelperLabel = (LabelInstr *)0x0;
  this->curRegion = (Region *)0x0;
  local_20 = tempAlloc;
  tempAlloc_local = (JitArenaAllocator *)func;
  func_local = (Func *)this;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::SList
            (&this->lifetimeList,&tempAlloc->super_ArenaAllocator);
  SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::SList
            (&this->opHelperBlockList,&local_20->super_ArenaAllocator);
  pJVar1 = local_20;
  this->totalOpHelperFullVisitedLength = 0;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&SListBase<Loop*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.h"
             ,0x35);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_58);
  this_00 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x10,pJVar1,0x4e98c0);
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::SListBase(this_00);
  this->extendedLifetimesLoopList = this_00;
  return;
}

Assistant:

SCCLiveness(Func *func, JitArenaAllocator *tempAlloc) : func(func),
        tempAlloc(tempAlloc), loopNest(0), lastCall(0), lastNonOpHelperCall(0),
        curLoop(NULL), lastOpHelperLabel(NULL), opHelperBlockList(tempAlloc),
        curRegion(NULL), lifetimeList(tempAlloc),
        totalOpHelperFullVisitedLength(0)
    {
        extendedLifetimesLoopList = JitAnew(tempAlloc, SListBase<Loop *>);
    }